

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O3

void __thiscall
kratos::PortBundleDefinition::add_definition
          (PortBundleDefinition *this,string *name,uint32_t width,uint32_t size,bool is_signed,
          PortDirection direction,PortType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  _Head_base<3UL,_kratos::PortDirection,_false> _Var1;
  _Head_base<3UL,_kratos::PortDirection,_false> _Var2;
  iterator iVar3;
  UserException *pUVar4;
  undefined3 in_register_00000081;
  undefined1 local_68 [8];
  _Head_base<2UL,_bool,_false> local_60;
  _Head_base<1UL,_unsigned_int,_false> local_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  uint32_t local_40;
  uint32_t local_3c;
  undefined4 local_38;
  _Head_base<3UL,_kratos::PortDirection,_false> local_34;
  
  local_38 = CONCAT31(in_register_00000081,is_signed);
  local_48 = name;
  local_34._M_head_impl = direction;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
          ::find(&(this->definitions_)._M_t,name);
  _Var1._M_head_impl = local_34._M_head_impl;
  __args = local_48;
  if ((_Rb_tree_header *)iVar3._M_node != &(this->definitions_)._M_t._M_impl.super__Rb_tree_header)
  {
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   local_48," already exists");
    UserException::UserException(pUVar4,(string *)local_68);
    __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68._4_4_ = local_34._M_head_impl;
  local_68._0_4_ = type;
  local_60._M_head_impl = SUB41(local_38,0);
  local_5c._M_head_impl = size;
  local_58._M_allocated_capacity._0_4_ = width;
  local_40 = width;
  local_3c = size;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
              *)&this->definitions_,local_48,
             (tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType> *)
             local_68);
  _Var2._M_head_impl = Out;
  if (_Var1._M_head_impl != In) {
    if (local_34._M_head_impl != Out) {
      pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
      local_68 = (undefined1  [8])&local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"PortBundle doesn\'t allow inout","");
      UserException::UserException(pUVar4,(string *)local_68);
      __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var2._M_head_impl = In;
  }
  local_68._4_4_ = _Var2._M_head_impl;
  local_60._M_head_impl = SUB41(local_38,0);
  local_5c._M_head_impl = local_3c;
  local_58._M_allocated_capacity._0_4_ = local_40;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
              *)&this->flipped_definitions_,__args,
             (tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType> *)
             local_68);
  return;
}

Assistant:

void PortBundleDefinition::add_definition(const std::string& name, uint32_t width, uint32_t size,
                                          bool is_signed, kratos::PortDirection direction,
                                          kratos::PortType type) {
    if (definitions_.find(name) != definitions_.end())
        throw UserException(name + " already exists");
    definitions_.emplace(name, std::make_tuple(width, size, is_signed, direction, type));
    PortDirection dir;
    if (direction == PortDirection::In) {
        dir = PortDirection::Out;
    } else if (direction == PortDirection::Out) {
        dir = PortDirection::In;
    } else {
        throw UserException("PortBundle doesn't allow inout");
    }
    flipped_definitions_.emplace(name, std::make_tuple(width, size, is_signed, dir, type));
}